

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyEmFromI(TidyDocImpl *doc,Node *node)

{
  Node *local_18;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  for (local_18 = node; local_18 != (Node *)0x0; local_18 = local_18->next) {
    if (((local_18 == (Node *)0x0) || (local_18->tag == (Dict *)0x0)) ||
       (local_18->tag->id != TidyTag_I)) {
      if (((local_18 != (Node *)0x0) && (local_18->tag != (Dict *)0x0)) &&
         (local_18->tag->id == TidyTag_B)) {
        RenameElem(doc,local_18,TidyTag_STRONG);
      }
    }
    else {
      RenameElem(doc,local_18,TidyTag_EM);
    }
    if (local_18->content != (Node *)0x0) {
      prvTidyEmFromI(doc,local_18->content);
    }
  }
  return;
}

Assistant:

void TY_(EmFromI)( TidyDocImpl* doc, Node* node )
{
    while (node)
    {
        if ( nodeIsI(node) )
            RenameElem( doc, node, TidyTag_EM );
        else if ( nodeIsB(node) )
            RenameElem( doc, node, TidyTag_STRONG );

        if ( node->content )
            TY_(EmFromI)( doc, node->content );

        node = node->next;
    }
}